

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,float *inner,int numInner,
          float *outer,int numOuter)

{
  undefined4 in_register_0000000c;
  int wrapLengthParam;
  int wrapLengthParam_00;
  long local_c0;
  float *local_b8;
  string local_b0;
  _anonymous_namespace_ *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _anonymous_namespace_ *local_48;
  string local_40;
  
  wrapLengthParam = (int)outer;
  local_90 = this + (long)(int)inner * 4;
  wrapLengthParam_00 = wrapLengthParam;
  local_c0 = CONCAT44(in_register_0000000c,numInner);
  local_48 = this;
  elemsStr<float_const*>
            (&local_40,(Functional *)&local_48,(float **)&local_90,(float **)0x0,wrapLengthParam,
             numOuter);
  std::operator+(&local_88,"inner: ",&local_40);
  std::operator+(&local_68,&local_88,", outer: ");
  local_b8 = (float *)(CONCAT44(in_register_0000000c,numInner) + (long)wrapLengthParam * 4);
  elemsStr<float_const*>
            (&local_b0,(Functional *)&local_c0,&local_b8,(float **)0x0,wrapLengthParam_00,numOuter);
  std::operator+(__return_storage_ptr__,&local_68,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static string tessellationLevelsString (const float* inner, int numInner, const float* outer, int numOuter)
{
	DE_ASSERT(numInner >= 0 && numOuter >= 0);
	return "inner: " + elemsStr(inner, inner+numInner) + ", outer: " + elemsStr(outer, outer+numOuter);
}